

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::__detail::_Node_iterator<std::thread::id,true,false>,std::__detail::_Node_iterator<std::thread::id,true,false>>
          (String *__return_storage_ptr__,detail *this,
          _Node_iterator<std::thread::id,_true,_false> *lhs,char *op,
          _Node_iterator<std::thread::id,_true,_false> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  _Node_iterator<std::thread::id,_true,_false> *local_28;
  _Node_iterator<std::thread::id,_true,_false> *rhs_local;
  char *op_local;
  _Node_iterator<std::thread::id,_true,_false> *lhs_local;
  
  local_28 = (_Node_iterator<std::thread::id,_true,_false> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (_Node_iterator<std::thread::id,_true,_false> *)__return_storage_ptr__;
  toString<std::__detail::_Node_iterator<std::thread::id,_true,_false>,_true>
            (&local_58,(_Node_iterator<std::thread::id,_true,_false> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::__detail::_Node_iterator<std::thread::id,_true,_false>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }